

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Solver::finalizeConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,uint32 ccRepMode)

{
  uint n_00;
  bool bVar1;
  size_type sVar2;
  uint32 uVar3;
  uint32 uVar4;
  Var VVar5;
  size_type sVar6;
  reference pLVar7;
  reference __b;
  ulong uVar8;
  Antecedent *this_00;
  iterator pLVar9;
  iterator pLVar10;
  int in_ECX;
  Solver *in_RDX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  Solver *in_RDI;
  bool n;
  const_iterator stop;
  const_iterator next;
  const_iterator tr;
  uint32 marked;
  Literal x;
  uint32 i_1;
  Var v;
  size_type i;
  bool tagged;
  Literal tagLit;
  uint32 maxVar;
  uint32 assertPos;
  uint32 assertLevel;
  uint32 varLevel;
  uint32 onRoot;
  uint32 lbd;
  undefined4 in_stack_fffffffffffffee8;
  Var in_stack_fffffffffffffeec;
  Solver *in_stack_fffffffffffffef0;
  Solver *in_stack_fffffffffffffef8;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff00;
  Score sc;
  undefined4 in_stack_ffffffffffffff08;
  Var in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  Literal in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  size_type ns;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar11;
  bool local_ad;
  iterator local_70;
  iterator local_68;
  int local_5c;
  Literal local_54;
  uint32 local_50;
  Literal local_4c;
  Var local_48;
  size_type local_44;
  undefined1 local_3d;
  uint32 local_3c;
  Literal local_38;
  Var local_34;
  size_type local_30;
  uint32 local_2c;
  uint32 local_28;
  int local_24;
  uint local_20;
  int local_1c;
  Solver *local_18;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_10;
  
  local_20 = 1;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[](in_RSI,0)
  ;
  local_34 = Literal::var(pLVar7);
  local_3c = (uint32)tagLiteral(in_RDI);
  local_38 = Literal::operator~((Literal *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_3d = 0;
  local_44 = 1;
  while( true ) {
    sVar6 = local_44;
    sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_10);
    ns = (size_type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (sVar6 == sVar2) break;
    pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,local_44);
    local_48 = Literal::var(pLVar7);
    clearSeen(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
              (local_10,local_44);
    bVar1 = Clasp::operator==((Literal *)in_stack_fffffffffffffef0,
                              (Literal *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (bVar1) {
      local_3d = 1;
    }
    if (local_34 < local_48) {
      local_34 = local_48;
    }
    local_28 = level(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    if (local_2c < local_28) {
      local_30 = local_44;
      local_2c = local_28;
    }
    bVar1 = hasLevel(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    if (bVar1) {
      unmarkLevel(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      uVar4 = local_28;
      uVar3 = rootLevel(in_RDI);
      local_ad = true;
      if (uVar4 <= uVar3) {
        local_24 = local_24 + 1;
        local_ad = local_24 == 1;
      }
      local_20 = local_ad + local_20;
    }
    local_44 = local_44 + 1;
  }
  if (local_30 != 1) {
    pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,1);
    __b = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                    (local_10,local_30);
    std::swap<Clasp::Literal>(pLVar7,__b);
  }
  if (local_1c == 3) {
    uVar8 = (ulong)local_20;
    uVar4 = decisionLevel((Solver *)0x1ee896);
    local_1c = 2;
    if (0.66 < (double)uVar8 / (double)uVar4) {
      local_1c = 1;
    }
  }
  if (local_1c != 0) {
    pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,0);
    local_34 = Literal::var(pLVar7);
    local_3d = 0;
    local_20 = 1;
    if (local_1c == 1) {
      Literal::Literal(&local_4c);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),ns,
                 (Literal *)CONCAT44(in_stack_ffffffffffffff14.rep_,in_stack_ffffffffffffff10));
      local_50 = local_2c;
      while (local_50 != 0) {
        local_50 = local_50 - 1;
        decision(in_stack_fffffffffffffef8,(uint32)((ulong)in_stack_fffffffffffffef0 >> 0x20));
        local_54 = Literal::operator~((Literal *)
                                      CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
        ;
        n_00 = local_20;
        local_20 = local_20 + 1;
        pLVar7 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                           (local_10,n_00);
        pLVar7->rep_ = local_54.rep_;
        bVar1 = Clasp::operator==((Literal *)in_stack_fffffffffffffef0,
                                  (Literal *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (bVar1) {
          local_3d = 1;
        }
        VVar5 = Literal::var(&local_54);
        if (local_34 < VVar5) {
          local_34 = Literal::var(&local_54);
        }
      }
    }
    else {
      uVar4 = sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1eea33);
      local_5c = uVar4 - 1;
      while (sVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                               (local_10), 1 < sVar6) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back(local_10);
        Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
        ;
        markSeen(in_stack_fffffffffffffef8,
                 (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pop_back(local_10);
      }
      local_68 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                           (&(in_RDI->assign_).trail);
LAB_001eeaa4:
      if (local_5c != 0) {
        do {
          local_68 = local_68 + -1;
          bVar1 = seen(in_stack_fffffffffffffef8,
                       (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        local_5c = local_5c + -1;
        bVar11 = 0;
        if (local_5c != 0) {
          this_00 = reason((Solver *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           (Literal)(uint32)((ulong)in_stack_fffffffffffffef0 >> 0x20));
          bVar1 = Antecedent::isNull(this_00);
          bVar11 = bVar1 ^ 0xff;
        }
        Literal::var(local_68);
        clearSeen(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        if ((bVar11 & 1) != 0) {
          pLVar9 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                             (&(in_RDI->assign_).trail);
          Literal::var(local_68);
          level(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          uVar4 = levelStart(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          local_70 = local_68;
          do {
            pLVar10 = local_70 + -1;
            in_stack_ffffffffffffff14.rep_ = in_stack_ffffffffffffff14.rep_ & 0xffffff;
            if (local_70 != pLVar9 + uVar4) {
              bVar1 = seen(in_stack_fffffffffffffef8,
                           (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
              in_stack_ffffffffffffff14.rep_ =
                   CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14.rep_) ^ 0xff000000;
            }
            local_70 = pLVar10;
          } while ((in_stack_ffffffffffffff14.rep_ & 0x1000000) != 0);
        }
        if ((bVar11 & 1) != 0) {
          Literal::var(local_70);
          uVar4 = level(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          Literal::var(local_68);
          uVar3 = level(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          if (uVar4 == uVar3) {
            reason((Solver *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff14,in_stack_ffffffffffffff00);
            while (bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::
                           empty(&in_RDI->conflict_), ((bVar1 ^ 0xffU) & 1) != 0) {
              bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back
                        (&in_RDI->conflict_);
              bVar1 = seen(in_stack_fffffffffffffef8,
                           (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
              if (!bVar1) {
                local_5c = local_5c + 1;
                bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::back
                          (&in_RDI->conflict_);
                markSeen(in_stack_fffffffffffffef8,
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
              }
              bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pop_back
                        (&in_RDI->conflict_);
            }
            goto LAB_001eeaa4;
          }
        }
        in_stack_ffffffffffffff00 = local_10;
        Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
        ;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (in_stack_ffffffffffffff00,(Literal *)in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff0c = Literal::var(local_68);
        VVar5 = Literal::var(&local_38);
        if (in_stack_ffffffffffffff0c == VVar5) {
          local_3d = 1;
        }
        VVar5 = Literal::var(local_68);
        if (local_34 < VVar5) {
          local_34 = Literal::var(local_68);
        }
        goto LAB_001eeaa4;
      }
      local_20 = sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1eedef)
      ;
    }
  }
  sc.rep = (uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  ConstraintScore::activity(&(in_RDI->ccInfo_).super_ConstraintScore);
  makeScore((uint32)local_18,in_stack_fffffffffffffeec);
  ConstraintInfo::setScore((ConstraintInfo *)in_stack_fffffffffffffef8,sc);
  ConstraintInfo::setTagged((ConstraintInfo *)local_18,SUB41(in_stack_fffffffffffffeec >> 0x18,0));
  auxVar(local_18,in_stack_fffffffffffffeec);
  ConstraintInfo::setAux((ConstraintInfo *)local_18,SUB41(in_stack_fffffffffffffeec >> 0x18,0));
  return local_2c;
}

Assistant:

uint32 Solver::finalizeConflictClause(LitVec& cc, ConstraintInfo& info, uint32 ccRepMode) {
	// 2. clear flags and compute lbd
	uint32  lbd         = 1;
	uint32  onRoot      = 0;
	uint32  varLevel    = 0;
	uint32  assertLevel = 0;
	uint32  assertPos   = 1;
	uint32  maxVar      = cc[0].var();
	Literal tagLit      = ~tagLiteral();
	bool    tagged      = false;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		Var v = cc[i].var();
		clearSeen(v);
		if (cc[i] == tagLit) { tagged = true; }
		if (v > maxVar)      { maxVar = v;    }
		if ( (varLevel = level(v)) > assertLevel ) {
			assertLevel = varLevel;
			assertPos   = static_cast<uint32>(i);
		}
		if (hasLevel(varLevel)) {
			unmarkLevel(varLevel);
			lbd += (varLevel > rootLevel()) || (++onRoot == 1);
		}
	}
	if (assertPos != 1) { std::swap(cc[1], cc[assertPos]); }
	if (ccRepMode == SolverStrategies::cc_rep_dynamic) {
		ccRepMode = double(lbd)/double(decisionLevel()) > .66 ? SolverStrategies::cc_rep_decision : SolverStrategies::cc_rep_uip;
	}
	if (ccRepMode) {
		maxVar = cc[0].var(), tagged = false, lbd = 1;
		if (ccRepMode == SolverStrategies::cc_rep_decision) {
			// replace cc with decision sequence
			cc.resize(assertLevel+1);
			for (uint32 i = assertLevel; i;){
				Literal x = ~decision(i--);
				cc[lbd++] = x;
				if (x == tagLit)     { tagged = true; }
				if (x.var() > maxVar){ maxVar = x.var(); }
			}
		}
		else {
			// replace cc with all uip clause
			uint32 marked = sizeVec(cc) - 1;
			while (cc.size() > 1) { markSeen(~cc.back()); cc.pop_back(); }
			for (LitVec::const_iterator tr = assign_.trail.end(), next, stop; marked;) {
				while (!seen(*--tr)) { ; }
				bool n = --marked != 0 && !reason(*tr).isNull();
				clearSeen(tr->var());
				if (n) { for (next = tr, stop = assign_.trail.begin() + levelStart(level(tr->var())); next-- != stop && !seen(*next);) { ; } }
				if (!n || level(next->var()) != level(tr->var())) {
					cc.push_back(~*tr);
					if (tr->var() == tagLit.var()){ tagged = true; }
					if (tr->var() > maxVar)       { maxVar = tr->var(); }
				}
				else {
					for (reason(*tr, conflict_); !conflict_.empty(); conflict_.pop_back()) {
						if (!seen(conflict_.back())) { ++marked; markSeen(conflict_.back()); }
					}
				}
			}
			lbd = sizeVec(cc);
		}
	}
	info.setScore(makeScore(ccInfo_.activity(), lbd));
	info.setTagged(tagged);
	info.setAux(auxVar(maxVar));
	return assertLevel;
}